

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addImportSleepSupport(TranslateToFuzzReader *this)

{
  Module *module;
  char *pcVar1;
  bool bVar2;
  Signature SVar3;
  string_view sVar4;
  string_view local_58;
  Name local_48;
  HeapType local_38;
  Type local_30;
  _Head_base<0UL,_wasm::Function_*,_false> local_28;
  __single_object func;
  
  if (this->preserveImportsAndExports == false) {
    bVar2 = Random::oneIn(&this->random,4);
    if (bVar2) {
      module = this->wasm;
      Name::Name((Name *)&local_58,"sleep");
      sVar4 = (string_view)Names::getValidFunctionName(module,(Name)local_58);
      (this->sleepImportName).super_IString.str = sVar4;
      std::make_unique<wasm::Function>();
      pcVar1 = (this->sleepImportName).super_IString.str._M_str;
      ((local_28._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
           (this->sleepImportName).super_IString.str._M_len;
      ((local_28._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar1
      ;
      Name::Name(&local_48,"fuzzing-support");
      ((local_28._M_head_impl)->super_Importable).module.super_IString.str._M_len =
           local_48.super_IString.str._M_len;
      ((local_28._M_head_impl)->super_Importable).module.super_IString.str._M_str =
           local_48.super_IString.str._M_str;
      Name::Name(&local_48,"sleep");
      *(undefined4 *)&((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_len =
           (undefined4)local_48.super_IString.str._M_len;
      *(undefined4 *)
       ((long)&((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_len + 4) =
           local_48.super_IString.str._M_len._4_4_;
      *(undefined4 *)&((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_str =
           local_48.super_IString.str._M_str._0_4_;
      *(undefined4 *)
       ((long)&((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_str + 4) =
           local_48.super_IString.str._M_str._4_4_;
      local_48.super_IString.str._M_len = 2;
      local_48.super_IString.str._M_str = (char *)0x2;
      wasm::Type::Type(&local_30);
      SVar3.results.id = 2;
      SVar3.params.id = local_30.id;
      wasm::HeapType::HeapType(&local_38,SVar3);
      ((local_28._M_head_impl)->type).id = local_38.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_28);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportSleepSupport() {
  // Fuzz this somewhat rarely, as it may be slow, and only when we can add
  // imports.
  if (preserveImportsAndExports || !oneIn(4)) {
    return;
  }

  // An import that sleeps for a given number of milliseconds, and also receives
  // an integer id. It returns that integer id (useful for tracking separate
  // sleeps).
  sleepImportName = Names::getValidFunctionName(wasm, "sleep");
  auto func = std::make_unique<Function>();
  func->name = sleepImportName;
  func->module = "fuzzing-support";
  func->base = "sleep";
  func->type = Signature({Type::i32, Type::i32}, Type::i32);
  wasm.addFunction(std::move(func));
}